

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O1

Dec_Graph_t *
Abc_ManResubQuit3(Abc_Obj_t *pRoot,Abc_Obj_t *pObj0,Abc_Obj_t *pObj1,Abc_Obj_t *pObj2,
                 Abc_Obj_t *pObj3,int fOrGate)

{
  int iVar1;
  int iVar2;
  Dec_Node_t *pDVar3;
  size_t sVar4;
  uint uVar5;
  Dec_Edge_t DVar6;
  Dec_Graph_t *pDVar7;
  Dec_Node_t *pDVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  uint uVar12;
  Dec_Edge_t DVar13;
  
  if (pObj0 == pObj1) {
    __assert_fail("pObj0 != pObj1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcResub.c"
                  ,0x306,
                  "Dec_Graph_t *Abc_ManResubQuit3(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, int)"
                 );
  }
  if (pObj2 != pObj3) {
    pDVar7 = (Dec_Graph_t *)malloc(0x20);
    pDVar7->fConst = 0;
    pDVar7->nLeaves = 0;
    pDVar7->nSize = 0;
    pDVar7->nCap = 0;
    pDVar7->pNodes = (Dec_Node_t *)0x0;
    *(undefined8 *)&pDVar7->eRoot = 0;
    pDVar7->nLeaves = 4;
    pDVar7->nSize = 4;
    pDVar7->nCap = 0x3a;
    pDVar8 = (Dec_Node_t *)malloc(0x570);
    pDVar7->pNodes = pDVar8;
    pDVar8->eEdge0 = (Dec_Edge_t)0x0;
    pDVar8->eEdge1 = (Dec_Edge_t)0x0;
    (pDVar8->field_2).pFunc = (void *)0x0;
    pDVar8[1].field_2.pFunc = (void *)0x0;
    *(undefined8 *)&pDVar8[1].field_0x10 = 0;
    pDVar8[2].eEdge0 = (Dec_Edge_t)0x0;
    pDVar8[2].eEdge1 = (Dec_Edge_t)0x0;
    pDVar8[2].field_2.pFunc = (void *)0x0;
    pDVar8[3].field_2.pFunc = (void *)0x0;
    *(undefined8 *)&pDVar8[3].field_0x10 = 0;
    *(undefined8 *)&pDVar8->field_0x10 = 0;
    pDVar8[1].eEdge0 = (Dec_Edge_t)0x0;
    pDVar8[1].eEdge1 = (Dec_Edge_t)0x0;
    *(undefined8 *)&pDVar8[2].field_0x10 = 0;
    pDVar8[3].eEdge0 = (Dec_Edge_t)0x0;
    pDVar8[3].eEdge1 = (Dec_Edge_t)0x0;
    (pDVar8->field_2).pFunc = (void *)((ulong)pObj0 & 0xfffffffffffffffe);
    pvVar11 = (void *)((ulong)pObj1 & 0xfffffffffffffffe);
    pDVar8[1].field_2.pFunc = pvVar11;
    pvVar10 = (void *)((ulong)pObj2 & 0xfffffffffffffffe);
    pDVar8[2].field_2.pFunc = pvVar10;
    pvVar9 = (void *)((ulong)pObj3 & 0xfffffffffffffffe);
    pDVar8[3].field_2.pFunc = pvVar9;
    uVar5 = *(uint *)((long)((ulong)pObj0 & 0xfffffffffffffffe) + 0x14) >> 7;
    if (((ulong)pObj1 & 1) == 0 || ((ulong)pObj0 & 1) == 0) {
      DVar6 = (Dec_Edge_t)((uVar5 ^ (uint)pObj0) & 1);
      uVar5 = ((uint)pObj1 ^ *(uint *)((long)pvVar11 + 0x14) >> 7) & 1;
      pDVar8 = pDVar7->pNodes;
      pDVar7->nSize = 5;
      pDVar8[4].eEdge0 = (Dec_Edge_t)0x0;
      pDVar8[4].eEdge1 = (Dec_Edge_t)0x0;
      pDVar8[4].field_2.pFunc = (void *)0x0;
      *(undefined8 *)&pDVar8[4].field_0x10 = 0;
      pDVar8[4].eEdge0 = DVar6;
      pDVar8[4].eEdge1 = (Dec_Edge_t)(uVar5 + 2);
      *(uint *)&pDVar8[4].field_0x10 = uVar5 << 0x10 | (int)DVar6 << 0xf;
      iVar1 = pDVar7->nSize;
      DVar6 = (Dec_Edge_t)(iVar1 * 2 + 0x7ffffffeU & 0x7ffffffe);
      uVar5 = *(uint *)((long)pvVar10 + 0x14) >> 7;
      if (((ulong)pObj3 & 1) == 0 || ((ulong)pObj2 & 1) == 0) {
        uVar5 = (uVar5 ^ (uint)pObj2) & 1;
        uVar12 = ((uint)pObj3 ^ *(uint *)((long)pvVar9 + 0x14) >> 7) & 1;
        if (iVar1 == pDVar7->nCap) {
          sVar4 = (long)pDVar7->nCap * 0x30;
          if (pDVar7->pNodes == (Dec_Node_t *)0x0) {
            pDVar8 = (Dec_Node_t *)malloc(sVar4);
          }
          else {
            pDVar8 = (Dec_Node_t *)realloc(pDVar7->pNodes,sVar4);
          }
          pDVar7->pNodes = pDVar8;
          pDVar7->nCap = pDVar7->nCap << 1;
        }
        pDVar3 = pDVar7->pNodes;
        iVar1 = pDVar7->nSize;
        pDVar7->nSize = iVar1 + 1;
        pDVar8 = pDVar3 + iVar1;
        pDVar8->eEdge0 = (Dec_Edge_t)0x0;
        pDVar8->eEdge1 = (Dec_Edge_t)0x0;
        (pDVar8->field_2).pFunc = (void *)0x0;
        *(undefined8 *)&pDVar3[iVar1].field_0x10 = 0;
        pDVar3[iVar1].eEdge0 = (Dec_Edge_t)(uVar5 + 4);
        pDVar3[iVar1].eEdge1 = (Dec_Edge_t)(uVar12 + 6);
        *(uint *)&pDVar3[iVar1].field_0x10 = uVar12 << 0x10 | uVar5 << 0xf;
        DVar13 = (Dec_Edge_t)(pDVar7->nSize * 2 + 0x7ffffffeU & 0x7ffffffe);
      }
      else {
        uVar5 = uVar5 & 1;
        uVar12 = *(uint *)((long)pvVar9 + 0x14) >> 7 & 1;
        if (iVar1 == pDVar7->nCap) {
          sVar4 = (long)pDVar7->nCap * 0x30;
          if (pDVar7->pNodes == (Dec_Node_t *)0x0) {
            pDVar8 = (Dec_Node_t *)malloc(sVar4);
          }
          else {
            pDVar8 = (Dec_Node_t *)realloc(pDVar7->pNodes,sVar4);
          }
          pDVar7->pNodes = pDVar8;
          pDVar7->nCap = pDVar7->nCap << 1;
        }
        pDVar3 = pDVar7->pNodes;
        iVar1 = pDVar7->nSize;
        pDVar7->nSize = iVar1 + 1;
        pDVar8 = pDVar3 + iVar1;
        pDVar8->eEdge0 = (Dec_Edge_t)0x0;
        pDVar8->eEdge1 = (Dec_Edge_t)0x0;
        (pDVar8->field_2).pFunc = (void *)0x0;
        *(undefined8 *)&pDVar3[iVar1].field_0x10 = 0;
        *(uint *)&pDVar3[iVar1].field_0x10 = uVar5 * 0x8000 + uVar12 * 0x10000 + 0x4000;
        pDVar3[iVar1].eEdge0 = (Dec_Edge_t)(uVar5 ^ 5);
        pDVar3[iVar1].eEdge1 = (Dec_Edge_t)(uVar12 ^ 7);
        DVar13 = (Dec_Edge_t)((pDVar7->nSize * 2 + 0x7ffffffeU & 0x7ffffffe) + 1);
      }
    }
    else {
      uVar5 = uVar5 & 1;
      uVar12 = *(uint *)((long)pvVar11 + 0x14) >> 7 & 1;
      pDVar8 = pDVar7->pNodes;
      pDVar7->nSize = 5;
      pDVar8[4].eEdge0 = (Dec_Edge_t)0x0;
      pDVar8[4].eEdge1 = (Dec_Edge_t)0x0;
      pDVar8[4].field_2.pFunc = (void *)0x0;
      *(undefined8 *)&pDVar8[4].field_0x10 = 0;
      *(uint *)&pDVar8[4].field_0x10 = uVar5 * 0x8000 + uVar12 * 0x10000 + 0x4000;
      pDVar8[4].eEdge0 = (Dec_Edge_t)(uVar5 ^ 1);
      pDVar8[4].eEdge1 = (Dec_Edge_t)(uVar12 ^ 3);
      uVar5 = *(uint *)((long)pvVar10 + 0x14) >> 7;
      if (((ulong)pObj3 & 1) == 0 || ((ulong)pObj2 & 1) == 0) {
        uVar5 = (uVar5 ^ (uint)pObj2) & 1;
        uVar12 = ((uint)pObj3 ^ *(uint *)((long)pvVar9 + 0x14) >> 7) & 1;
        if (pDVar7->nCap == 5) {
          if (pDVar8 == (Dec_Node_t *)0x0) {
            pDVar8 = (Dec_Node_t *)malloc(0xf0);
          }
          else {
            pDVar8 = (Dec_Node_t *)realloc(pDVar8,0xf0);
          }
          pDVar7->pNodes = pDVar8;
          pDVar7->nCap = 10;
        }
        pDVar8 = pDVar7->pNodes;
        pDVar7->nSize = 6;
        pDVar8[5].eEdge0 = (Dec_Edge_t)0x0;
        pDVar8[5].eEdge1 = (Dec_Edge_t)0x0;
        pDVar8[5].field_2.pFunc = (void *)0x0;
        *(undefined8 *)&pDVar8[5].field_0x10 = 0;
        pDVar8[5].eEdge0 = (Dec_Edge_t)(uVar5 + 4);
        pDVar8[5].eEdge1 = (Dec_Edge_t)(uVar12 + 6);
        *(uint *)&pDVar8[5].field_0x10 = uVar12 << 0x10 | uVar5 << 0xf;
        DVar6 = (Dec_Edge_t)0x9;
        DVar13 = (Dec_Edge_t)0xa;
      }
      else {
        uVar5 = uVar5 & 1;
        uVar12 = *(uint *)((long)pvVar9 + 0x14) >> 7 & 1;
        if (pDVar7->nCap == 5) {
          if (pDVar8 == (Dec_Node_t *)0x0) {
            pDVar8 = (Dec_Node_t *)malloc(0xf0);
          }
          else {
            pDVar8 = (Dec_Node_t *)realloc(pDVar8,0xf0);
          }
          pDVar7->pNodes = pDVar8;
          pDVar7->nCap = 10;
        }
        pDVar8 = pDVar7->pNodes;
        pDVar7->nSize = 6;
        pDVar8[5].eEdge0 = (Dec_Edge_t)0x0;
        pDVar8[5].eEdge1 = (Dec_Edge_t)0x0;
        pDVar8[5].field_2.pFunc = (void *)0x0;
        *(undefined8 *)&pDVar8[5].field_0x10 = 0;
        *(uint *)&pDVar8[5].field_0x10 = uVar5 * 0x8000 + uVar12 * 0x10000 + 0x4000;
        pDVar8[5].eEdge0 = (Dec_Edge_t)(uVar5 ^ 5);
        pDVar8[5].eEdge1 = (Dec_Edge_t)(uVar12 ^ 7);
        DVar6 = (Dec_Edge_t)0x9;
        DVar13 = (Dec_Edge_t)0xb;
      }
    }
    iVar1 = pDVar7->nSize;
    iVar2 = pDVar7->nCap;
    if (fOrGate == 0) {
      if (iVar1 == iVar2) {
        sVar4 = (long)iVar2 * 0x30;
        if (pDVar7->pNodes == (Dec_Node_t *)0x0) {
          pDVar8 = (Dec_Node_t *)malloc(sVar4);
        }
        else {
          pDVar8 = (Dec_Node_t *)realloc(pDVar7->pNodes,sVar4);
        }
        pDVar7->pNodes = pDVar8;
        pDVar7->nCap = pDVar7->nCap << 1;
      }
      pDVar3 = pDVar7->pNodes;
      iVar1 = pDVar7->nSize;
      pDVar7->nSize = iVar1 + 1;
      pDVar8 = pDVar3 + iVar1;
      pDVar8->eEdge0 = (Dec_Edge_t)0x0;
      pDVar8->eEdge1 = (Dec_Edge_t)0x0;
      (pDVar8->field_2).pFunc = (void *)0x0;
      *(undefined8 *)&pDVar3[iVar1].field_0x10 = 0;
      pDVar3[iVar1].eEdge0 = DVar6;
      pDVar3[iVar1].eEdge1 = DVar13;
      *(uint *)&pDVar3[iVar1].field_0x10 = ((uint)DVar13 & 1) << 0x10 | ((uint)DVar6 & 1) << 0xf;
      DVar6 = (Dec_Edge_t)(pDVar7->nSize * 2 + 0x7ffffffeU & 0x7ffffffe);
    }
    else {
      if (iVar1 == iVar2) {
        sVar4 = (long)iVar2 * 0x30;
        if (pDVar7->pNodes == (Dec_Node_t *)0x0) {
          pDVar8 = (Dec_Node_t *)malloc(sVar4);
        }
        else {
          pDVar8 = (Dec_Node_t *)realloc(pDVar7->pNodes,sVar4);
        }
        pDVar7->pNodes = pDVar8;
        pDVar7->nCap = iVar2 * 2;
      }
      pDVar3 = pDVar7->pNodes;
      pDVar7->nSize = iVar1 + 1;
      pDVar8 = pDVar3 + iVar1;
      pDVar8->eEdge0 = (Dec_Edge_t)0x0;
      pDVar8->eEdge1 = (Dec_Edge_t)0x0;
      (pDVar8->field_2).pFunc = (void *)0x0;
      *(undefined8 *)&pDVar3[iVar1].field_0x10 = 0;
      *(uint *)&pDVar3[iVar1].field_0x10 =
           ((uint)DVar6 & 1) * 0x8000 + ((uint)DVar13 & 1) * 0x10000 + 0x4000;
      pDVar3[iVar1].eEdge0 = (Dec_Edge_t)((uint)DVar6 ^ 1);
      pDVar3[iVar1].eEdge1 = (Dec_Edge_t)((uint)DVar13 ^ 1);
      DVar6 = (Dec_Edge_t)((iVar1 * 2 + 0x80000000U & 0x7ffffffe) + 1);
    }
    pDVar7->eRoot = DVar6;
    if ((pRoot->field_0x14 & 0x80) != 0) {
      pDVar7->eRoot = (Dec_Edge_t)((uint)DVar6 ^ 1);
    }
    return pDVar7;
  }
  __assert_fail("pObj2 != pObj3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcResub.c"
                ,0x307,
                "Dec_Graph_t *Abc_ManResubQuit3(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, int)"
               );
}

Assistant:

Dec_Graph_t * Abc_ManResubQuit3( Abc_Obj_t * pRoot, Abc_Obj_t * pObj0, Abc_Obj_t * pObj1, Abc_Obj_t * pObj2, Abc_Obj_t * pObj3, int fOrGate )
{
    Dec_Graph_t * pGraph;
    Dec_Edge_t eRoot, ePrev0, ePrev1, eNode0, eNode1, eNode2, eNode3;
    assert( pObj0 != pObj1 );
    assert( pObj2 != pObj3 );
    pGraph = Dec_GraphCreate( 4 );
    Dec_GraphNode( pGraph, 0 )->pFunc = Abc_ObjRegular(pObj0);
    Dec_GraphNode( pGraph, 1 )->pFunc = Abc_ObjRegular(pObj1);
    Dec_GraphNode( pGraph, 2 )->pFunc = Abc_ObjRegular(pObj2);
    Dec_GraphNode( pGraph, 3 )->pFunc = Abc_ObjRegular(pObj3);
    if ( Abc_ObjIsComplement(pObj0) && Abc_ObjIsComplement(pObj1) )
    {
        eNode0 = Dec_EdgeCreate( 0, Abc_ObjRegular(pObj0)->fPhase );
        eNode1 = Dec_EdgeCreate( 1, Abc_ObjRegular(pObj1)->fPhase );
        ePrev0 = Dec_GraphAddNodeOr( pGraph, eNode0, eNode1 );
        if ( Abc_ObjIsComplement(pObj2) && Abc_ObjIsComplement(pObj3) )
        {
            eNode2 = Dec_EdgeCreate( 2, Abc_ObjRegular(pObj2)->fPhase );
            eNode3 = Dec_EdgeCreate( 3, Abc_ObjRegular(pObj3)->fPhase );
            ePrev1 = Dec_GraphAddNodeOr( pGraph, eNode2, eNode3 );
        }
        else
        {
            eNode2 = Dec_EdgeCreate( 2, Abc_ObjRegular(pObj2)->fPhase ^ Abc_ObjIsComplement(pObj2) );
            eNode3 = Dec_EdgeCreate( 3, Abc_ObjRegular(pObj3)->fPhase ^ Abc_ObjIsComplement(pObj3) );
            ePrev1 = Dec_GraphAddNodeAnd( pGraph, eNode2, eNode3 );
        }
    }
    else
    {
        eNode0 = Dec_EdgeCreate( 0, Abc_ObjRegular(pObj0)->fPhase ^ Abc_ObjIsComplement(pObj0) );
        eNode1 = Dec_EdgeCreate( 1, Abc_ObjRegular(pObj1)->fPhase ^ Abc_ObjIsComplement(pObj1) );
        ePrev0 = Dec_GraphAddNodeAnd( pGraph, eNode0, eNode1 );
        if ( Abc_ObjIsComplement(pObj2) && Abc_ObjIsComplement(pObj3) )
        {
            eNode2 = Dec_EdgeCreate( 2, Abc_ObjRegular(pObj2)->fPhase );
            eNode3 = Dec_EdgeCreate( 3, Abc_ObjRegular(pObj3)->fPhase );
            ePrev1 = Dec_GraphAddNodeOr( pGraph, eNode2, eNode3 );
        }
        else
        {
            eNode2 = Dec_EdgeCreate( 2, Abc_ObjRegular(pObj2)->fPhase ^ Abc_ObjIsComplement(pObj2) );
            eNode3 = Dec_EdgeCreate( 3, Abc_ObjRegular(pObj3)->fPhase ^ Abc_ObjIsComplement(pObj3) );
            ePrev1 = Dec_GraphAddNodeAnd( pGraph, eNode2, eNode3 );
        }
    }
    if ( fOrGate ) 
        eRoot = Dec_GraphAddNodeOr( pGraph, ePrev0, ePrev1 );
    else
        eRoot = Dec_GraphAddNodeAnd( pGraph, ePrev0, ePrev1 );
    Dec_GraphSetRoot( pGraph, eRoot );
    if ( pRoot->fPhase )
        Dec_GraphComplement( pGraph );
    return pGraph;
}